

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

IEventListenerPtr __thiscall
Catch::ReporterRegistry::create(ReporterRegistry *this,string *name,ReporterConfig *config)

{
  bool bVar1;
  pointer ppVar2;
  IReporterFactory *pIVar3;
  undefined8 in_RCX;
  unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl> *in_RSI;
  IEventListener *in_RDI;
  const_iterator it;
  IEventListener *this_00;
  _Self local_30;
  _Self local_28;
  undefined8 local_20;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->(in_RSI);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
               *)this_00,(key_type *)0x18db84);
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->(in_RSI);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
              *)this_00);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    Detail::unique_ptr<Catch::IEventListener>::unique_ptr
              ((unique_ptr<Catch::IEventListener> *)this_00,(nullptr_t)0x0);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>
                           *)0x18dbd2);
    pIVar3 = Detail::unique_ptr<Catch::IReporterFactory>::operator->(&ppVar2->second);
    (*pIVar3->_vptr_IReporterFactory[2])(this_00,pIVar3,local_20);
  }
  return (IEventListenerPtr)in_RDI;
}

Assistant:

IEventListenerPtr
    ReporterRegistry::create( std::string const& name,
                              ReporterConfig&& config ) const {
        auto it = m_impl->factories.find( name );
        if ( it == m_impl->factories.end() ) return nullptr;
        return it->second->create( CATCH_MOVE( config ) );
    }